

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

SquareMatrix<4> * __thiscall
pbrt::SquareMatrix<4>::operator+(SquareMatrix<4> *this,SquareMatrix<4> *m)

{
  long in_RDX;
  void *in_RSI;
  SquareMatrix<4> *in_RDI;
  int j;
  int i;
  int local_18;
  int local_14;
  
  memcpy(in_RDI,in_RSI,0x40);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      in_RDI->m[local_14][local_18] =
           *(float *)(in_RDX + (long)local_14 * 0x10 + (long)local_18 * 4) +
           in_RDI->m[local_14][local_18];
    }
  }
  return in_RDI;
}

Assistant:

operator+(const SquareMatrix &m) const {
        SquareMatrix r = *this;
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                r.m[i][j] += m.m[i][j];
        return r;
    }